

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_check_collision_ray_box(rf_ray ray,rf_bounding_box box)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __y;
  double __y_00;
  double __y_01;
  double __y_02;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  
  dVar1 = (double)((in_stack_00000020 - in_stack_00000008) / in_stack_00000014);
  __y_00 = (double)((in_stack_0000002c - in_stack_00000008) / in_stack_00000014);
  dVar2 = fmin(dVar1,__y_00);
  dVar3 = (double)((in_stack_00000024 - in_stack_0000000c) / in_stack_00000018);
  __y_01 = (double)((in_stack_00000030 - in_stack_0000000c) / in_stack_00000018);
  dVar4 = fmin(dVar3,__y_01);
  dVar2 = fmax(dVar2,dVar4);
  dVar4 = (double)((in_stack_00000028 - in_stack_00000010) / in_stack_0000001c);
  __y_02 = (double)((in_stack_00000034 - in_stack_00000010) / in_stack_0000001c);
  __y = fmin(dVar4,__y_02);
  dVar2 = fmax(dVar2,__y);
  dVar1 = fmax(dVar1,__y_00);
  dVar3 = fmax(dVar3,__y_01);
  dVar1 = fmin(dVar1,dVar3);
  dVar3 = fmax(dVar4,__y_02);
  dVar1 = fmin(dVar1,dVar3);
  return (_Bool)(-(0.0 <= (float)dVar1) & -((float)dVar2 <= (float)dVar1) & 1);
}

Assistant:

RF_API bool rf_check_collision_ray_box(rf_ray ray, rf_bounding_box box)
{
    bool collision = false;

    float t[8];
    t[0] = (box.min.x - ray.position.x) / ray.direction.x;
    t[1] = (box.max.x - ray.position.x) / ray.direction.x;
    t[2] = (box.min.y - ray.position.y) / ray.direction.y;
    t[3] = (box.max.y - ray.position.y) / ray.direction.y;
    t[4] = (box.min.z - ray.position.z) / ray.direction.z;
    t[5] = (box.max.z - ray.position.z) / ray.direction.z;
    t[6] = (float) fmax(fmax(fmin(t[0], t[1]), fmin(t[2], t[3])), fmin(t[4], t[5]));
    t[7] = (float) fmin(fmin(fmax(t[0], t[1]), fmax(t[2], t[3])), fmax(t[4], t[5]));

    collision = !(t[7] < 0 || t[6] > t[7]);

    return collision;
}